

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsFoodWeb_ASAp_kry.c
# Opt level: O2

void SetGroups(int m,int ng,int *jg,int *jig,int *jr)

{
  long lVar1;
  undefined4 in_register_00000034;
  undefined4 in_register_0000003c;
  
  *(undefined8 *)CONCAT44(in_register_0000003c,m) = 0xa00000000;
  *(undefined4 *)(CONCAT44(in_register_0000003c,m) + 8) = 0x14;
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    *(undefined4 *)(CONCAT44(in_register_00000034,ng) + lVar1 * 4) = 0;
  }
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    *(undefined4 *)(CONCAT44(in_register_00000034,ng) + 0x28 + lVar1 * 4) = 1;
  }
  jg[0] = 4;
  jg[1] = 0xe;
  return;
}

Assistant:

static void SetGroups(int m, int ng, int jg[], int jig[], int jr[])
{
  int ig, j, len1, mper, ngm1;

  mper = m / ng; /* does integer division */
  for (ig = 0; ig < ng; ig++) { jg[ig] = ig * mper; }
  jg[ng] = m;

  ngm1 = ng - 1;
  len1 = ngm1 * mper;
  for (j = 0; j < len1; j++) { jig[j] = j / mper; }
  for (j = len1; j < m; j++) { jig[j] = ngm1; }

  for (ig = 0; ig < ngm1; ig++) { jr[ig] = ((2 * ig + 1) * mper - 1) / 2; }
  jr[ngm1] = (ngm1 * mper + m - 1) / 2;
}